

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcScheduleTimeControl::IfcScheduleTimeControl
          (IfcScheduleTimeControl *this)

{
  *(undefined ***)&this->field_0x270 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x278 = 0;
  *(char **)&this->field_0x280 = "IfcScheduleTimeControl";
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__007e4788);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcScheduleTimeControl,_18UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x7e46a8;
  *(undefined8 *)&this->field_0x270 = 0x7e4770;
  *(undefined8 *)&this->field_0x88 = 0x7e46d0;
  *(undefined8 *)&this->field_0x98 = 0x7e46f8;
  *(undefined8 *)&this->field_0xd0 = 0x7e4720;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcScheduleTimeControl,_18UL>).
  _vptr_ObjectHelper = (_func_int **)0x7e4748;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcScheduleTimeControl,_18UL>).field_0x10 = 0
  ;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcScheduleTimeControl,_18UL>).field_0x18 = 0
  ;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcScheduleTimeControl,_18UL>).field_0x20 = 0;
  (this->EarlyStart).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->EarlyStart).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->EarlyStart).have = false;
  (this->LateStart).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->LateStart).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->LateStart).have = false;
  (this->ScheduleStart).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ScheduleStart).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ScheduleStart).have = false;
  (this->ActualFinish).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ActualFinish).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ActualFinish).have = false;
  (this->EarlyFinish).have = false;
  (this->EarlyFinish).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->EarlyFinish).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->LateFinish).have = false;
  (this->LateFinish).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->LateFinish).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ScheduleFinish).have = false;
  (this->ScheduleFinish).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ScheduleFinish).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ScheduleDuration).have = false;
  (this->ActualDuration).have = false;
  (this->RemainingTime).have = false;
  (this->FreeFloat).have = false;
  (this->TotalFloat).have = false;
  (this->IsCritical).ptr._M_dataplus._M_p = (pointer)&(this->IsCritical).ptr.field_2;
  (this->IsCritical).ptr._M_string_length = 0;
  (this->IsCritical).ptr.field_2._M_local_buf[0] = '\0';
  (this->IsCritical).have = false;
  (this->StatusTime).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->StatusTime).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->StatusTime).have = false;
  (this->StartFloat).have = false;
  (this->FinishFloat).have = false;
  (this->Completion).have = false;
  return;
}

Assistant:

IfcScheduleTimeControl() : Object("IfcScheduleTimeControl") {}